

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O3

idx_t __thiscall duckdb::ReservoirSample::FillReservoir(ReservoirSample *this,DataChunk *chunk)

{
  unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true> *this_00;
  sel_t *psVar1;
  idx_t iVar2;
  pointer pRVar3;
  reference pvVar4;
  DataChunk *this_;
  InternalException *this_01;
  pointer *__ptr;
  size_type __n;
  ulong uVar5;
  SelectionVector sel_for_input_chunk;
  vector<duckdb::LogicalType,_true> types;
  SelectionVector local_78;
  undefined1 local_60 [32];
  DataChunk *local_40;
  unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true> *local_38;
  
  this_00 = &this->reservoir_chunk;
  if ((this->reservoir_chunk).
      super_unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>._M_t.
      super___uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>
      .super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl == (ReservoirChunk *)0x0)
  {
    if (0x800 < chunk->count) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      local_60._0_8_ = local_60 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_60,
                 "Creating sample with DataChunk that is larger than the fixed sample size","");
      InternalException::InternalException(this_01,(string *)local_60);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)local_60,chunk);
    CreateNewSampleChunk
              ((ReservoirSample *)&local_78,(vector<duckdb::LogicalType,_true> *)this,
               (idx_t)local_60);
    psVar1 = local_78.sel_vector;
    local_78.sel_vector = (sel_t *)0x0;
    ::std::__uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>::
    reset((__uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_> *)
          this_00,(pointer)psVar1);
    psVar1 = local_78.sel_vector;
    if ((DataChunk *)local_78.sel_vector != (DataChunk *)0x0) {
      DataChunk::~DataChunk((DataChunk *)local_78.sel_vector);
      operator_delete(psVar1);
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_60);
  }
  iVar2 = GetActiveSampleCount(this);
  pRVar3 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
           operator->(this_00);
  uVar5 = this->sample_count;
  if ((pRVar3->chunk).count < uVar5) {
    local_38 = this_00;
    pRVar3 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
             operator->(this_00);
    uVar5 = uVar5 - (pRVar3->chunk).count;
    if (chunk->count <= uVar5) {
      uVar5 = chunk->count;
    }
    local_40 = chunk;
    GetRandomizedVector((vector<unsigned_int,_true> *)local_60,this,(uint32_t)uVar5,(uint32_t)uVar5)
    ;
    SelectionVector::SelectionVector(&local_78,uVar5);
    if (uVar5 != 0) {
      __n = 0;
      do {
        (this->sel).sel_vector[iVar2 + __n] = (int)iVar2 + (int)__n;
        pvVar4 = vector<unsigned_int,_true>::operator[]((vector<unsigned_int,_true> *)local_60,__n);
        *(value_type *)
         ((long)&(((DataChunk *)local_78.sel_vector)->data).
                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_start + __n * 4) = *pvVar4;
        __n = __n + 1;
      } while (uVar5 != __n);
    }
    this_ = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
             operator->(local_38)->chunk;
    UpdateSampleAppend(this,this_,local_40,&local_78,uVar5);
    this->sel_size = this->sel_size + uVar5;
    if (local_78.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if ((pointer)local_60._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_60._0_8_);
    }
  }
  else {
    uVar5 = 0;
  }
  return uVar5;
}

Assistant:

idx_t ReservoirSample::FillReservoir(DataChunk &chunk) {

	idx_t ingested_count = 0;
	if (!reservoir_chunk) {
		if (chunk.size() > FIXED_SAMPLE_SIZE) {
			throw InternalException("Creating sample with DataChunk that is larger than the fixed sample size");
		}
		auto types = chunk.GetTypes();
		// create a new sample chunk to store new samples
		reservoir_chunk = CreateNewSampleChunk(types, GetReservoirChunkCapacity<idx_t>());
	}

	idx_t actual_sample_index_start = GetActiveSampleCount();
	D_ASSERT(reservoir_chunk->chunk.ColumnCount() == chunk.ColumnCount());

	if (reservoir_chunk->chunk.size() < sample_count) {
		ingested_count = MinValue<idx_t>(sample_count - reservoir_chunk->chunk.size(), chunk.size());
		auto random_other_sel =
		    GetRandomizedVector(static_cast<uint32_t>(ingested_count), static_cast<uint32_t>(ingested_count));
		SelectionVector sel_for_input_chunk(ingested_count);
		for (idx_t i = 0; i < ingested_count; i++) {
			sel.set_index(actual_sample_index_start + i, actual_sample_index_start + i);
			sel_for_input_chunk.set_index(i, random_other_sel[i]);
		}
		UpdateSampleAppend(reservoir_chunk->chunk, chunk, sel_for_input_chunk, ingested_count);
		sel_size += ingested_count;
	}
	D_ASSERT(GetActiveSampleCount() <= sample_count);
	D_ASSERT(GetActiveSampleCount() >= ingested_count);
	// always return how many tuples were ingested
	return ingested_count;
}